

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRequest.cpp
# Opt level: O1

void __thiscall HttpRequest::parseMethod(HttpRequest *this,char *method)

{
  ulong uVar1;
  int iVar2;
  MethodType MVar3;
  ulong uVar4;
  
  iVar2 = strcmp(method,"OPTIONS");
  if (iVar2 == 0) {
    MVar3 = kMethodOptions;
  }
  else {
    MVar3 = kMethodUnknown;
    uVar1 = 0;
    do {
      uVar4 = uVar1;
      if (uVar4 == 7) goto LAB_00119a85;
      iVar2 = strcmp(method,gMethodTypeList[uVar4 + 1]);
      uVar1 = uVar4 + 1;
    } while (iVar2 != 0);
    this->mMethod = (MethodType)(uVar4 + 1);
    if (uVar4 < 7) {
      return;
    }
  }
LAB_00119a85:
  this->mMethod = MVar3;
  return;
}

Assistant:

void HttpRequest::parseMethod( const char *method )
{
	TRACE_BEGIN( LOG_LVL_INFO );

	for ( uint32_t i = 0; i < JH_ARRAY_SIZE( gMethodTypeList ); i++ )
	{
		//LOG_NOISE( "matching %s", gMethodTypeList[ i ] );
		if ( strcmp( method, gMethodTypeList[ i ] ) == 0 )
		{
			mMethod = (MethodType)i;
			LOG( "Found method %s", gMethodTypeList[ mMethod ] );
			return;
		}
	}
	
	LOG( "Failed to match method \"%s\"", method );
	mMethod = kMethodUnknown;
}